

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WienerFilter.cpp
# Opt level: O2

double WienerFilterImpl(Mat *src,Mat *dst,double noiseVariance,Size *block)

{
  double dVar1;
  uint uVar2;
  uint _cols;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  char *__assertion;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  __m128d t;
  Size local_508;
  Size local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  Mat1d variances;
  Mat1d means;
  Mat1d avgVarianceMat;
  Mat1d sqrMeans;
  _InputArray local_368 [14];
  undefined4 local_208;
  Mat *local_200;
  undefined8 local_1f8;
  Mat1d means2;
  _InputArray local_190 [14];
  
  if (((((block->width & 0x80000001U) == 1) && (1 < block->height)) && (1 < (uint)block->width)) &&
     ((block->height & 0x80000001U) == 1)) {
    if ((*(ushort *)dst & 0xff8) == 0) {
      uVar2 = *(uint *)(src + 8);
      _cols = *(uint *)(src + 0xc);
      cv::Mat_<unsigned_char>::Mat_((Mat_<unsigned_char> *)local_368,uVar2,_cols);
      cv::Mat::operator=(dst,(Mat *)local_368);
      cv::Mat::~Mat((Mat *)local_368);
      cv::Mat_<double>::Mat_(&means);
      cv::Mat_<double>::Mat_(&sqrMeans);
      cv::Mat_<double>::Mat_(&variances);
      cv::Mat_<double>::Mat_(&avgVarianceMat);
      local_368[0].sz.width = 0;
      local_368[0].sz.height = 0;
      local_368[0].flags = 0x1010000;
      local_190[0].sz.width = 0;
      local_190[0].sz.height = 0;
      local_190[0].flags = -0x7dfefffa;
      local_500 = *block;
      local_4f0 = 0xffffffffffffffff;
      local_368[0].obj = src;
      local_190[0].obj = &means.super_Mat;
      cv::boxFilter(local_368,local_190,6,&local_500,&local_4f0,1,1);
      local_368[0].sz.width = 0;
      local_368[0].sz.height = 0;
      local_368[0].flags = 0x1010000;
      local_190[0].sz.width = 0;
      local_190[0].sz.height = 0;
      local_190[0].flags = -0x7dfefffa;
      local_190[0].obj = &sqrMeans;
      local_508 = *block;
      local_4f8 = 0xffffffffffffffff;
      local_368[0].obj = src;
      cv::sqrBoxFilter(local_368,local_190,6,&local_508,&local_4f8,1,1);
      local_190[0].sz.width = 0;
      local_190[0].sz.height = 0;
      local_190[0].flags = -0x7efefffa;
      local_190[0].obj = &means.super_Mat;
      cv::Mat::mul(local_368,1.0);
      cv::Mat_<double>::Mat_(&means2,(MatExpr *)local_368);
      cv::MatExpr::~MatExpr((MatExpr *)local_368);
      local_1f8 = 0;
      local_208 = 0x81010006;
      local_200 = &means.super_Mat;
      cv::Mat::mul(local_190,1.0);
      cv::operator-((Mat *)local_368,(MatExpr *)&sqrMeans);
      (**(code **)(*(long *)CONCAT44(local_368[0]._4_4_,local_368[0].flags) + 0x18))
                ((long *)CONCAT44(local_368[0]._4_4_,local_368[0].flags),local_368,&variances);
      cv::MatExpr::~MatExpr((MatExpr *)local_368);
      cv::MatExpr::~MatExpr((MatExpr *)local_190);
      if (noiseVariance < 0.0) {
        local_368[0].sz.width = 0;
        local_368[0].sz.height = 0;
        local_190[0].sz.width = 0;
        local_190[0].sz.height = 0;
        local_368[0].flags = -0x7efefffa;
        local_190[0].flags = -0x7dfefffa;
        local_368[0].obj = &variances;
        local_190[0].obj = &avgVarianceMat.super_Mat;
        cv::reduce(local_368,(_OutputArray *)local_190,1,0,-1);
        local_368[0].sz.width = 0;
        local_368[0].sz.height = 0;
        local_190[0].sz.width = 0;
        local_190[0].sz.height = 0;
        local_368[0].flags = -0x7efefffa;
        local_190[0].flags = -0x7dfefffa;
        local_368[0].obj = &avgVarianceMat.super_Mat;
        local_190[0].obj = &avgVarianceMat.super_Mat;
        cv::reduce(local_368,(_OutputArray *)local_190,0,0,-1);
        noiseVariance = *(double *)avgVarianceMat._16_8_ / (double)(int)(_cols * uVar2);
      }
      uVar9 = 0;
      uVar12 = (ulong)_cols;
      if ((int)_cols < 1) {
        uVar12 = uVar9;
      }
      uVar13 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar13 = uVar9;
      }
      for (; uVar9 != uVar13; uVar9 = uVar9 + 1) {
        lVar3 = **(long **)(dst + 0x48);
        lVar4 = *(long *)(dst + 0x10);
        lVar5 = **(long **)(src + 0x48);
        lVar6 = *(long *)(src + 0x10);
        lVar7 = *(long *)variances._72_8_;
        lVar8 = *(long *)means._72_8_;
        for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
          dVar1 = *(double *)(lVar8 * uVar9 + means._16_8_ + uVar10 * 8);
          dVar14 = *(double *)(lVar7 * uVar9 + variances._16_8_ + uVar10 * 8);
          dVar15 = noiseVariance;
          if (noiseVariance <= dVar14) {
            dVar15 = dVar14;
          }
          dVar14 = dVar14 - noiseVariance;
          if (dVar14 <= 0.0) {
            dVar14 = 0.0;
          }
          iVar11 = (int)ROUND(((double)*(byte *)(lVar5 * uVar9 + lVar6 + uVar10) - dVar1) *
                              (dVar14 / dVar15) + dVar1);
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          *(char *)(lVar3 * uVar9 + lVar4 + uVar10) = (char)iVar11;
        }
      }
      cv::Mat::~Mat(&means2.super_Mat);
      cv::Mat::~Mat(&avgVarianceMat.super_Mat);
      cv::Mat::~Mat(&variances.super_Mat);
      cv::Mat::~Mat(&sqrMeans.super_Mat);
      cv::Mat::~Mat(&means.super_Mat);
      return noiseVariance;
    }
    __assertion = 
    "(\"src and dst must be one channel grayscale images\", src.channels() == 1, dst.channels() == 1)"
    ;
    uVar2 = 0x28;
  }
  else {
    __assertion = 
    "(\"Invalid block dimensions\", block.width % 2 == 1 && block.height % 2 == 1 && block.width > 1 && block.height > 1)"
    ;
    uVar2 = 0x27;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/prittt[P]AdaptiveWienerFilter/WienerFilter.cpp"
                ,uVar2,"double WienerFilterImpl(const Mat &, Mat &, double, const Size &)");
}

Assistant:

double WienerFilterImpl(const Mat& src, Mat& dst, double noiseVariance, const Size& block) {
	assert(("Invalid block dimensions", block.width % 2 == 1 && block.height % 2 == 1 && block.width > 1 && block.height > 1));
	assert(("src and dst must be one channel grayscale images", src.channels() == 1, dst.channels() == 1));

	int h = src.rows;
	int w = src.cols;

	dst = Mat1b(h, w);

	Mat1d means, sqrMeans, variances;
	Mat1d avgVarianceMat;

	boxFilter(src, means, CV_64F, block, Point(-1, -1), true, BORDER_REPLICATE);
	sqrBoxFilter(src, sqrMeans, CV_64F, block, Point(-1, -1), true, BORDER_REPLICATE);

	Mat1d means2 = means.mul(means);
	variances = sqrMeans - (means.mul(means));

	if (noiseVariance < 0) {
		// I have to estimate the noiseVariance
		reduce(variances, avgVarianceMat, 1, REDUCE_SUM, -1);
		reduce(avgVarianceMat, avgVarianceMat, 0, REDUCE_SUM, -1);
		noiseVariance = avgVarianceMat(0, 0) / (h * w);
	}

	for (int r = 0; r < h; ++r) {
		// get row pointers
		uchar const* const srcRow = src.ptr<uchar>(r);
		uchar* const dstRow = dst.ptr<uchar>(r);
		double* const varRow = variances.ptr<double>(r);
		double* const meanRow = means.ptr<double>(r);
		for (int c = 0; c < w; ++c) {
			dstRow[c] = saturate_cast<uchar>(
				meanRow[c] + max(0., varRow[c] - noiseVariance) / max(varRow[c], noiseVariance) * (srcRow[c] - meanRow[c])
			);
		}
	}

	return noiseVariance;
}